

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O3

void __thiscall InsertProxyModelPrivate::afterSort(InsertProxyModelPrivate *this,bool isRow)

{
  InsertProxyModel *pIVar1;
  QMap<int,_QVariant> *pQVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  reference pQVar7;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar8;
  long lVar9;
  uint uVar10;
  undefined7 in_register_00000031;
  QModelIndexList toList;
  QList<QMap<int,_QVariant>_> oldlayout;
  undefined4 local_c4;
  QList<QModelIndex> local_b8;
  QArrayDataPointer<QMap<int,_QVariant>_> local_a0;
  long local_88;
  QList<QMap<int,_QVariant>_> *local_80;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *local_78;
  quintptr local_70;
  QAbstractItemModel *pQStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  pIVar1 = this->q_ptr;
  plVar6 = (long *)QAbstractProxyModel::sourceModel();
  if ((int)CONCAT71(in_register_00000031,isRow) == 0) {
    uVar10 = 1;
    lVar9 = 0x80;
  }
  else {
    uVar10 = 2;
    lVar9 = 0x78;
  }
  local_a0.d = (Data *)0xffffffffffffffff;
  local_a0.ptr = (QMap<int,_QVariant> *)0x0;
  local_a0.size = 0;
  uVar4 = (**(code **)(*plVar6 + lVar9))(plVar6);
  if (((this->m_insertDirection).i & uVar10) != 0) {
    bVar3 = !isRow;
    local_a0.d = this->m_extraData[bVar3].d.d;
    local_a0.ptr = this->m_extraData[bVar3].d.ptr;
    local_a0.size = this->m_extraData[bVar3].d.size;
    if (local_a0.d != (Data *)0x0) {
      LOCK();
      ((local_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (isRow) {
      plVar6 = (long *)QAbstractProxyModel::sourceModel();
      local_b8.d.d = (Data *)0xffffffffffffffff;
      local_b8.d.ptr = (QModelIndex *)0x0;
      local_b8.d.size = 0;
      local_c4 = (**(code **)(*plVar6 + 0x80))(plVar6);
    }
    else {
      plVar6 = (long *)QAbstractProxyModel::sourceModel();
      local_78 = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                  *)0xffffffffffffffff;
      local_70 = 0;
      pQStack_68 = (QAbstractItemModel *)0x0;
      local_c4 = (**(code **)(*plVar6 + 0x78))(plVar6);
    }
    local_b8.d.d = (Data *)0x0;
    local_b8.d.ptr = (QModelIndex *)0x0;
    local_b8.d.size = 0;
    QList<QModelIndex>::reserve(&local_b8,(long)(int)uVar4);
    if (0 < (int)uVar4) {
      local_80 = this->m_extraData + bVar3;
      local_88 = (ulong)uVar4 << 3;
      lVar9 = 0;
      do {
        if (isRow) {
          iVar5 = QPersistentModelIndex::row();
        }
        else {
          iVar5 = QPersistentModelIndex::column();
        }
        pQVar2 = local_a0.ptr;
        pQVar7 = QList<QMap<int,_QVariant>_>::operator[](local_80,(long)iVar5);
        pQVar8 = *(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                   **)((long)&(pQVar2->d).d + lVar9);
        if (pQVar8 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                       *)0x0) {
          pQVar8 = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                    *)0x0;
        }
        else {
          LOCK();
          (pQVar8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i =
               (pQVar8->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_78 = (pQVar7->d).d;
        (pQVar7->d).d = pQVar8;
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2
                  ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                    *)&local_78);
        if (isRow) {
          local_48 = 0xffffffffffffffff;
          local_40 = 0;
          uStack_38 = 0;
          (**(code **)(*(long *)pIVar1 + 0x60))
                    ((QModelIndex *)&local_78,pIVar1,iVar5,local_c4,&local_48);
        }
        else {
          local_60 = 0xffffffffffffffff;
          local_58 = 0;
          uStack_50 = 0;
          (**(code **)(*(long *)pIVar1 + 0x60))
                    ((QModelIndex *)&local_78,pIVar1,local_c4,iVar5,&local_60);
        }
        QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex>
                  ((QMovableArrayOps<QModelIndex> *)&local_b8,local_b8.d.size,
                   (QModelIndex *)&local_78);
        lVar9 = lVar9 + 8;
      } while (local_88 != lVar9);
    }
    QAbstractItemModel::changePersistentIndexList
              ((QList *)pIVar1,(QList *)&this->m_layoutChangeExtraProxyIndexes);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,0x18,8);
      }
    }
    QArrayDataPointer<QMap<int,_QVariant>_>::~QArrayDataPointer(&local_a0);
  }
  QList<QModelIndex>::clear(&this->m_layoutChangeExtraProxyIndexes);
  QList<QPersistentModelIndex>::clear(&this->m_layoutChangeExtraPersistentIndexes);
  return;
}

Assistant:

void InsertProxyModelPrivate::afterSort(bool isRow)
{
    Q_Q(InsertProxyModel);
    const int maxSortedIdx = isRow ? q->sourceModel()->rowCount() : q->sourceModel()->columnCount();
    const InsertProxyModel::InsertDirections directionCheck = isRow ? InsertProxyModel::InsertColumn : InsertProxyModel::InsertRow;
    if (m_insertDirection & directionCheck) {
        const auto oldlayout = m_extraData[!isRow];
        const int maxSecondaryIdx = isRow ? q->sourceModel()->columnCount() : q->sourceModel()->rowCount();
        QModelIndexList toList;
        toList.reserve(maxSortedIdx);
        Q_ASSERT(m_layoutChangeExtraPersistentIndexes.size() == maxSortedIdx);
        for (int i = 0; i < maxSortedIdx; ++i) {
            const int newSortedIdx = isRow ? m_layoutChangeExtraPersistentIndexes.at(i).row() : m_layoutChangeExtraPersistentIndexes.at(i).column();
            m_extraData[!isRow][newSortedIdx] = oldlayout.at(i);
            toList << (isRow ? q->index(newSortedIdx, maxSecondaryIdx) : q->index(maxSecondaryIdx, newSortedIdx));
        }
        q->changePersistentIndexList(m_layoutChangeExtraProxyIndexes, toList);
    }
    m_layoutChangeExtraProxyIndexes.clear();
    m_layoutChangeExtraPersistentIndexes.clear();
}